

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

ExtPubkey * __thiscall
cfd::core::HDWallet::GeneratePubkey
          (ExtPubkey *__return_storage_ptr__,HDWallet *this,NetType network_type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path)

{
  ExtPrivkey privkey;
  ExtPrivkey local_90;
  
  ExtPrivkey::ExtPrivkey(&local_90,&this->seed_,network_type);
  ExtPrivkey::DerivePubkey(__return_storage_ptr__,&local_90,path);
  if (local_90.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.privkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey HDWallet::GeneratePubkey(
    NetType network_type, const std::vector<uint32_t>& path) const {
  ExtPrivkey privkey(seed_, network_type);
  return privkey.DerivePubkey(path);
}